

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O0

void __thiscall
TTD::ExecutionInfoManager::GetLastExecutedTimeAndPositionForDebugger
          (ExecutionInfoManager *this,TTDebuggerSourceLocation *sourceLocation)

{
  FunctionBody *this_00;
  int64 etime;
  uint64 ftime;
  uint64 ltime;
  TTLastReturnLocationInfo *this_01;
  bool bVar1;
  uint startOffset_00;
  SingleCallCounter *pSVar2;
  LONG local_28;
  uint32 startOffset;
  LONG srcColumn;
  ULONG srcLine;
  TTLastReturnLocationInfo *cframe;
  TTDebuggerSourceLocation *sourceLocation_local;
  ExecutionInfoManager *this_local;
  
  _srcColumn = &this->m_lastReturnLocation;
  cframe = (TTLastReturnLocationInfo *)sourceLocation;
  sourceLocation_local = (TTDebuggerSourceLocation *)this;
  bVar1 = TTLastReturnLocationInfo::IsDefined(_srcColumn);
  if (bVar1) {
    startOffset = 0;
    local_28 = -1;
    pSVar2 = TTLastReturnLocationInfo::GetLocation(_srcColumn);
    this_00 = pSVar2->Function;
    pSVar2 = TTLastReturnLocationInfo::GetLocation(_srcColumn);
    startOffset_00 =
         Js::FunctionBody::GetStatementStartOffset(this_00,pSVar2->CurrentStatementIndex);
    pSVar2 = TTLastReturnLocationInfo::GetLocation(_srcColumn);
    Js::FunctionBody::GetSourceLineFromStartOffset_TTD
              (pSVar2->Function,startOffset_00,&startOffset,&local_28);
    this_01 = cframe;
    etime = this->m_topLevelCallbackEventTime;
    pSVar2 = TTLastReturnLocationInfo::GetLocation(_srcColumn);
    ftime = pSVar2->FunctionTime;
    pSVar2 = TTLastReturnLocationInfo::GetLocation(_srcColumn);
    ltime = pSVar2->CurrentStatementLoopTime;
    pSVar2 = TTLastReturnLocationInfo::GetLocation(_srcColumn);
    TTDebuggerSourceLocation::SetLocationFull
              ((TTDebuggerSourceLocation *)this_01,etime,ftime,ltime,pSVar2->Function,startOffset,
               local_28);
  }
  else {
    TTDebuggerSourceLocation::Clear((TTDebuggerSourceLocation *)cframe);
  }
  return;
}

Assistant:

void ExecutionInfoManager::GetLastExecutedTimeAndPositionForDebugger(TTDebuggerSourceLocation& sourceLocation) const
    {
        const TTLastReturnLocationInfo& cframe = this->m_lastReturnLocation;

        if(!cframe.IsDefined())
        {
            sourceLocation.Clear();
            return;
        }
        else
        {
            ULONG srcLine = 0;
            LONG srcColumn = -1;
            uint32 startOffset = cframe.GetLocation().Function->GetStatementStartOffset(cframe.GetLocation().CurrentStatementIndex);
            cframe.GetLocation().Function->GetSourceLineFromStartOffset_TTD(startOffset, &srcLine, &srcColumn);

            sourceLocation.SetLocationFull(this->m_topLevelCallbackEventTime, cframe.GetLocation().FunctionTime, cframe.GetLocation().CurrentStatementLoopTime, cframe.GetLocation().Function, srcLine, srcColumn);
        }
    }